

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O0

void FileUtil::readSparseMatrixLocally
               (SparseMatrix *R,SparseMatrix *Rt,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *user_item_R,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *item_user_R,int start_user_id,int end_user_id,int start_item_id,int end_item_id)

{
  bool bVar1;
  mapped_type *__x;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  pair<int,_double> pVar2;
  int in_stack_00000008;
  int in_stack_00000010;
  int idx_1;
  int item_id;
  int idx;
  int user_id;
  value_type *in_stack_ffffffffffffff18;
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  *in_stack_ffffffffffffff20;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffff28;
  mapped_type *in_stack_ffffffffffffff30;
  int local_ac;
  _Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
  local_90;
  _Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
  local_88;
  int local_7c;
  int local_78;
  double local_70;
  int local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  _Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
  local_38;
  int local_2c;
  int local_28;
  long local_10;
  long local_8;
  
  local_28 = in_R9D;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = in_R8D; local_2c < local_28; local_2c = local_2c + 1) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
         ::find((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                 *)in_stack_ffffffffffffff18,(key_type *)0x16c81c);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
         ::end((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    if (bVar1) {
      local_58 = (undefined1  [16])0x0;
      local_48 = 0;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 0x16c87d);
      std::
      unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::operator[](in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->first);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                (in_stack_ffffffffffffff30);
    }
    if (*(int *)(*(long *)(local_10 + 0x38) + (long)(local_2c + 1) * 4) !=
        *(int *)(*(long *)(local_10 + 0x38) + (long)local_2c * 4)) {
      for (local_68 = *(int *)(*(long *)(local_10 + 0x38) + (long)local_2c * 4);
          local_68 < *(int *)(*(long *)(local_10 + 0x38) + (long)(local_2c + 1) * 4);
          local_68 = local_68 + 1) {
        in_stack_ffffffffffffff30 =
             std::
             unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->first);
        pVar2 = std::make_pair<int&,double&>
                          ((int *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
        local_70 = pVar2.second;
        local_78 = pVar2.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
  }
  for (local_7c = in_stack_00000008; local_7c < in_stack_00000010; local_7c = local_7c + 1) {
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
         ::find((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                 *)in_stack_ffffffffffffff18,(key_type *)0x16ca2b);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
         ::end((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::__detail::operator==(&local_88,&local_90);
    if (bVar1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 0x16ca74);
      __x = std::
            unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
            ::operator[](in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->first);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_ffffffffffffff30,__x);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                (in_stack_ffffffffffffff30);
    }
    if (*(int *)(*(long *)(local_8 + 0x38) + (long)(local_7c + 1) * 4) !=
        *(int *)(*(long *)(local_8 + 0x38) + (long)local_7c * 4)) {
      for (local_ac = *(int *)(*(long *)(local_8 + 0x38) + (long)local_7c * 4);
          local_ac < *(int *)(*(long *)(local_8 + 0x38) + (long)(local_7c + 1) * 4);
          local_ac = local_ac + 1) {
        in_stack_ffffffffffffff20 =
             (unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
              *)std::
                unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                ::operator[](in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->first);
        std::make_pair<int&,double&>
                  ((int *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
  }
  return;
}

Assistant:

void readSparseMatrixLocally(const SparseMatrix &R, const SparseMatrix &Rt, unordered_map<int, vector<pair<int, value_type > > > &user_item_R,
                                 unordered_map<int, vector<pair<int, value_type > > > &item_user_R,
                                 const int start_user_id, const int end_user_id, const int start_item_id,
                                 const int end_item_id) {

        for (int user_id = start_user_id; user_id < end_user_id; user_id++) {

            if(user_item_R.find(user_id)==user_item_R.end()){
                user_item_R[user_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (Rt.ccs_col_ptr[user_id + 1] == Rt.ccs_col_ptr[user_id]) {
                continue;
            }

            for (int idx = Rt.ccs_col_ptr[user_id]; idx < Rt.ccs_col_ptr[user_id + 1]; idx++) {
                user_item_R[user_id].push_back(std::make_pair(Rt.ccs_row_idx[idx], Rt.ccs_rating_scores[idx]));
            }
        }

        for (int item_id = start_item_id; item_id < end_item_id; item_id++) {

            if(item_user_R.find(item_id)==item_user_R.end()){
                item_user_R[item_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (R.ccs_col_ptr[item_id + 1] == R.ccs_col_ptr[item_id]) {
                continue;
            }

            for (int idx = R.ccs_col_ptr[item_id]; idx < R.ccs_col_ptr[item_id + 1]; idx++) {
                item_user_R[item_id].push_back(std::make_pair(R.ccs_row_idx[idx], R.ccs_rating_scores[idx]));
            }
        }

    }